

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O3

void __thiscall WavFileWriter::~WavFileWriter(WavFileWriter *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->m_OutFile).super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_OutFile) {
    p_Var2 = (this->m_OutFile).super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var2[1]._M_next)->_M_next->_M_prev)();
      p_Var2 = (this->m_OutFile).
               super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl._M_node
               .super__List_node_base._M_prev;
    }
    psVar1 = &(this->m_OutFile).
              super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    p_Var2 = (this->m_OutFile).super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
  }
  return;
}

Assistant:

~WavFileWriter()
    {
      while ( ! m_OutFile.empty() )
	{
	  delete m_OutFile.back();
	  m_OutFile.pop_back();
	}
    }